

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O3

uint __thiscall
Indexing::HashingClauseVariantIndex::computeHash
          (HashingClauseVariantIndex *this,Literal **lits,uint length)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  undefined1 auVar4 [12];
  uint uVar5;
  Entry *pEVar6;
  Entry *pEVar7;
  uint *__first;
  uint *__last;
  uint uVar8;
  Entry *pEVar9;
  uchar *puVar10;
  uint hash_begin;
  ulong uVar11;
  byte *pbVar12;
  uchar *x;
  byte *pbVar13;
  
  if (computeHash(Kernel::Literal_const**,unsigned_int)::litOrder == '\0') {
    computeHash();
  }
  computeHash::litOrder._cursor = computeHash::litOrder._stack;
  auVar4._4_8_ = 0;
  auVar4._0_4_ = length;
  Lib::Stack<unsigned_int>::loadFromIterator<Lib::RangeIterator<unsigned_int>>
            (&computeHash::litOrder,(RangeIterator<unsigned_int>)(auVar4 << 0x40));
  __last = computeHash::litOrder._cursor;
  __first = computeHash::litOrder._stack;
  if (computeHash::litOrder._stack != computeHash::litOrder._cursor) {
    uVar11 = (long)computeHash::litOrder._cursor - (long)computeHash::litOrder._stack >> 2;
    lVar2 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_comp_iter<Indexing::HashingClauseVariantIndex::VariableIgnoringComparator>>
              (computeHash::litOrder._stack,computeHash::litOrder._cursor,
               (ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<Indexing::HashingClauseVariantIndex::VariableIgnoringComparator>)
               lits);
    std::
    __final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_comp_iter<Indexing::HashingClauseVariantIndex::VariableIgnoringComparator>>
              (__first,__last,
               (_Iter_comp_iter<Indexing::HashingClauseVariantIndex::VariableIgnoringComparator>)
               lits);
  }
  if (computeHash(Kernel::Literal_const**,unsigned_int)::varCnts == '\0') {
    computeHash();
  }
  Lib::DHMap<unsigned_int,_unsigned_char,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
            (&computeHash::varCnts);
  if (length == 0) {
    hash_begin = 0x811c9dc5;
  }
  else {
    hash_begin = 0x811c9dc5;
    uVar11 = 0;
    do {
      hash_begin = computeHashAndCountVariables
                             (this,lits[computeHash::litOrder._stack[uVar11]],&computeHash::varCnts,
                              hash_begin);
      uVar11 = uVar11 + 1;
    } while (length != uVar11);
  }
  if (computeHash::varCnts._size != 0) {
    puVar10 = computeHash::varCntHistogram._stack;
    uVar5 = computeHash::varCnts._timestamp;
    pEVar6 = computeHash::varCnts._entries;
    pEVar7 = computeHash::varCnts._afterLast;
    pbVar12 = computeHash::varCntHistogram._stack;
    pbVar13 = computeHash::varCntHistogram._stack;
    if (computeHash(Kernel::Literal_const**,unsigned_int)::varCntHistogram == '\0') {
      computeHash();
      puVar10 = computeHash::varCntHistogram._stack;
      uVar5 = computeHash::varCnts._timestamp;
      pEVar6 = computeHash::varCnts._entries;
      pEVar7 = computeHash::varCnts._afterLast;
      pbVar12 = computeHash::varCntHistogram._stack;
      pbVar13 = computeHash::varCntHistogram._stack;
    }
    for (; computeHash::varCntHistogram._cursor = puVar10, pEVar9 = computeHash::varCnts._afterLast,
        uVar8 = computeHash::varCnts._timestamp, computeHash::varCntHistogram._stack = pbVar13,
        pEVar6 != computeHash::varCnts._afterLast; pEVar6 = pEVar6 + 1) {
      bVar3 = (uint)(pEVar6->field_0)._infoData >> 2 == computeHash::varCnts._timestamp;
      computeHash::varCnts._timestamp = uVar5;
      computeHash::varCnts._afterLast = pEVar7;
      if (((pEVar6->field_0)._infoData & 1U) == 0 && bVar3) {
        bVar1 = pEVar6->_val;
        if (pbVar12 == computeHash::varCntHistogram._end) {
          Lib::Stack<unsigned_char>::expand(&computeHash::varCntHistogram);
          pbVar12 = computeHash::varCntHistogram._cursor;
        }
        *pbVar12 = bVar1;
        pbVar12 = computeHash::varCntHistogram._cursor + 1;
        computeHash::varCntHistogram._cursor = pbVar12;
      }
      puVar10 = computeHash::varCntHistogram._cursor;
      uVar5 = computeHash::varCnts._timestamp;
      pEVar7 = computeHash::varCnts._afterLast;
      pbVar13 = computeHash::varCntHistogram._stack;
      computeHash::varCnts._afterLast = pEVar9;
      computeHash::varCnts._timestamp = uVar8;
    }
    computeHash::varCnts._timestamp = uVar5;
    computeHash::varCnts._afterLast = pEVar7;
    if (pbVar13 != pbVar12) {
      lVar2 = 0x3f;
      if ((long)pbVar12 - (long)pbVar13 != 0) {
        for (; (ulong)((long)pbVar12 - (long)pbVar13) >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::__introsort_loop<unsigned_char*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar13,pbVar12,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<unsigned_char*,__gnu_cxx::__ops::_Iter_less_iter>(pbVar13,pbVar12)
      ;
      pbVar12 = computeHash::varCntHistogram._cursor;
      pbVar13 = computeHash::varCntHistogram._stack;
    }
    for (; pbVar13 != pbVar12; pbVar13 = pbVar13 + 1) {
      hash_begin = hash_begin ^
                   (*pbVar13 ^ 0x811c9dc5) * 0x1000193 + (hash_begin >> 2) + hash_begin * 0x40 +
                   0x9e3779b9;
    }
  }
  return hash_begin;
}

Assistant:

unsigned HashingClauseVariantIndex::computeHash(Literal* const * lits, unsigned length)
{
  // cout << "length " <<  length << endl;

  TIME_TRACE("hvci compute hash");

  static Stack<unsigned> litOrder;
  litOrder.reset();
  litOrder.loadFromIterator(getRangeIterator(0u,length));

  std::sort(litOrder.begin(), litOrder.end(), VariableIgnoringComparator(lits));

  static VarCounts varCnts;
  varCnts.reset();

  unsigned hash = 2166136261u;
  for(unsigned i=0; i<length; i++) {
    unsigned li = litOrder[i];
    hash = computeHashAndCountVariables(lits[li],varCnts,hash);
  }

  if (varCnts.size() > 0) {
    static Stack<unsigned char> varCntHistogram;
    varCntHistogram.reset();
    VarCounts::Iterator it(varCnts);
    while (it.hasNext()) {
      varCntHistogram.push(it.next());
    }

    std::sort(varCntHistogram.begin(),varCntHistogram.end());
    hash = DefaultHash::hash(varCntHistogram, hash);
  }

  return hash;
}